

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spanning_tree.cc
# Opt level: O2

void fail_send(socket_t fd,void *buf,int count)

{
  ssize_t sVar1;
  int *piVar2;
  char *pcVar3;
  ostream *poVar4;
  vw_exception *this;
  char *__buf;
  string local_2c0;
  stringstream __msg;
  ostream local_290 [376];
  char __errmsg [256];
  
  sVar1 = send(fd,buf,(long)count,0);
  if (sVar1 != -1) {
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
  poVar4 = local_290;
  std::operator<<(poVar4,"send: ");
  piVar2 = __errno_location();
  __buf = __errmsg;
  pcVar3 = strerror_r(*piVar2,__buf,0x100);
  if (pcVar3 == (char *)0x0) {
    poVar4 = std::operator<<(poVar4,"errno = ");
  }
  else {
    __buf = "errno = unknown";
  }
  std::operator<<(poVar4,__buf);
  this = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  VW::vw_exception::vw_exception
            (this,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/spanning_tree.cc"
             ,0x4f,&local_2c0);
  __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

void fail_send(const socket_t fd, const void* buf, const int count)
{
  if (send(fd, (char*)buf, count, 0) == -1)
    THROWERRNO("send: ");
}